

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O2

void __thiscall lwlog::details::pattern::request_flag_formatters(pattern *this)

{
  const_iterator cVar1;
  pointer pbVar2;
  pointer pbVar3;
  basic_string_view<char,_std::char_traits<char>_> flag;
  key_type local_68;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_58;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_40;
  
  parse_verbose_flags((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&local_40,this);
  parse_short_flags((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)&local_58,this);
  for (pbVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = local_58._M_impl.super__Vector_impl_data._M_start,
      pbVar2 != local_40._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    local_68._M_len = pbVar2->_M_len;
    local_68._M_str = pbVar2->_M_str;
    cVar1 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)verbose_data,&local_68);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::
      vector<std::shared_ptr<lwlog::details::formatter>,_std::allocator<std::shared_ptr<lwlog::details::formatter>_>_>
      ::push_back(&this->m_formatters,
                  (value_type *)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
                         ._M_cur + 0x18));
    }
  }
  for (; pbVar3 != local_58._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    local_68._M_len = pbVar3->_M_len;
    local_68._M_str = pbVar3->_M_str;
    cVar1 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)shortened_data,&local_68);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::
      vector<std::shared_ptr<lwlog::details::formatter>,_std::allocator<std::shared_ptr<lwlog::details::formatter>_>_>
      ::push_back(&this->m_formatters,
                  (value_type *)
                  ((long)cVar1.
                         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<lwlog::details::formatter>_>,_true>
                         ._M_cur + 0x18));
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_58);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_40);
  return;
}

Assistant:

void pattern::request_flag_formatters()
	{
		const auto& verbose_flags{ this->parse_verbose_flags() };
		const auto& short_flags{ this->parse_short_flags() };

		for (const auto flag : verbose_flags)
		{
			if (const auto it{ verbose_data.find(flag) }; 
				it != verbose_data.end())
			{
				m_formatters.push_back(it->second);
			}
		}

		for (const auto flag : short_flags)
		{
			if (const auto it{ shortened_data.find(flag) }; 
				it != shortened_data.end())
			{
				m_formatters.push_back(it->second);
			}
		}
	}